

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckEqual<int,FIX::BeginSeqNo>
               (TestResults *results,int *expected,BeginSeqNo *actual,TestDetails *details)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  char *failure;
  MemoryOutStream stream;
  undefined1 auStack_1c8 [408];
  
  iVar1 = *expected;
  iVar2 = FIX::IntField::getValue(&actual->super_SeqNumField);
  if (iVar1 != iVar2) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)auStack_1c8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1c8,"Expected ",9);
    poVar3 = (ostream *)std::ostream::operator<<(auStack_1c8,*expected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," but was ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(actual->super_SeqNumField).super_FieldBase.m_string._M_dataplus._M_p,
               (actual->super_SeqNumField).super_FieldBase.m_string._M_string_length);
    failure = MemoryOutStream::GetText((MemoryOutStream *)auStack_1c8);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)auStack_1c8,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(auStack_1c8 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}